

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

Type __thiscall wasm::TranslateToFuzzReader::getSuperType(TranslateToFuzzReader *this,Type type)

{
  bool bVar1;
  Nullability nullability_00;
  Type local_50;
  uintptr_t local_48;
  uintptr_t local_40;
  Nullability local_34;
  HeapType HStack_30;
  Nullability nullability;
  HeapType local_28;
  HeapType heapType;
  TranslateToFuzzReader *this_local;
  Type type_local;
  Type superType;
  
  heapType.id = (uintptr_t)this;
  HStack_30.id = ::wasm::Type::getHeapType();
  local_28 = getSuperType(this,HStack_30);
  nullability_00 = ::wasm::Type::getNullability();
  local_34 = getSuperType(this,nullability_00);
  local_40 = local_28.id;
  ::wasm::Type::Type(&type_local,local_28,local_34);
  local_48 = type_local.id;
  bVar1 = isUninhabitable(type_local);
  if (bVar1) {
    ::wasm::Type::Type(&local_50,local_28,Nullable);
    type_local.id = local_50.id;
  }
  return (Type)type_local.id;
}

Assistant:

Type TranslateToFuzzReader::getSuperType(Type type) {
  auto heapType = getSuperType(type.getHeapType());
  auto nullability = getSuperType(type.getNullability());
  auto superType = Type(heapType, nullability);
  // As with getSubType, we want to avoid returning an uninhabitable type where
  // possible. Here all we can do is flip the super's nullability to nullable.
  if (isUninhabitable(superType)) {
    superType = Type(heapType, Nullable);
  }
  return superType;
}